

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O2

void __thiscall
TPZSYsmpMatrix<long_double>::AddKel
          (TPZSYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  longdouble *plVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble lVar13;
  longdouble in_ST3;
  longdouble lVar14;
  longdouble in_ST4;
  longdouble lVar15;
  longdouble in_ST5;
  longdouble lVar16;
  
  lVar5 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar4 = 0;
  lVar9 = 0;
  do {
    if (lVar5 <= lVar9) {
      return;
    }
    for (lVar10 = 0; lVar10 < lVar5; lVar10 = lVar10 + 1) {
      lVar5 = destinationindex->fStore[lVar9];
      lVar1 = destinationindex->fStore[lVar10];
      lVar11 = in_ST0;
      lVar12 = in_ST1;
      lVar13 = in_ST2;
      lVar14 = in_ST3;
      lVar15 = in_ST4;
      if ((lVar5 <= lVar1) &&
         ((*(elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(elmat,lVar9,lVar10), lVar11 = in_ST1, lVar12 = in_ST2,
         lVar13 = in_ST3, lVar14 = in_ST4, lVar15 = in_ST5, (longdouble)1e-16 <= ABS(in_ST0))) {
        lVar8 = lVar4 + 1;
        plVar7 = (this->fIA).fStore;
        lVar2 = plVar7[lVar5];
        lVar5 = plVar7[lVar5 + 1];
        if (lVar8 < lVar2) {
          plVar7 = (this->fJA).fStore;
        }
        else {
          plVar7 = (this->fJA).fStore;
          if ((lVar8 < lVar5) && (plVar7[lVar4 + 1] == lVar1)) {
            plVar6 = (this->fA).fStore;
            plVar6[lVar8] = plVar6[lVar8] + in_ST0;
            lVar4 = lVar8;
            goto LAB_00d5de88;
          }
        }
        lVar4 = lVar5;
        if (lVar5 < lVar2) {
          lVar4 = lVar2;
        }
        lVar8 = lVar2 << 4;
        for (; lVar2 < lVar5; lVar2 = lVar2 + 1) {
          if (plVar7[lVar2] == lVar1) {
            if (lVar1 == -1) goto LAB_00d5de73;
            plVar6 = (this->fA).fStore;
            in_ST0 = *(longdouble *)((long)plVar6 + lVar8) + in_ST0;
LAB_00d5de80:
            *(longdouble *)((long)plVar6 + lVar8) = in_ST0;
            lVar4 = lVar2;
            goto LAB_00d5de88;
          }
          if (plVar7[lVar2] == -1) {
LAB_00d5de73:
            plVar7[lVar2] = lVar1;
            plVar6 = (this->fA).fStore;
            goto LAB_00d5de80;
          }
          lVar8 = lVar8 + 0x10;
        }
        lVar16 = in_ST5;
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line ="
                                );
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3," column =");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        lVar11 = in_ST1;
        lVar12 = in_ST2;
        lVar13 = in_ST3;
        lVar14 = in_ST4;
        lVar15 = in_ST5;
        in_ST5 = lVar16;
      }
LAB_00d5de88:
      lVar5 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      in_ST0 = lVar11;
      in_ST1 = lVar12;
      in_ST2 = lVar13;
      in_ST3 = lVar14;
      in_ST4 = lVar15;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void TPZSYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            if(jpos<ipos) continue;
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) std::cout << "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << std::endl;         }
        }
    }
}